

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

triplet<unsigned_char> __thiscall
charls::
jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::encoder_strategy>::
encode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::encoder_strategy>
           *this,triplet<unsigned_char> x,triplet<unsigned_char> ra,triplet<unsigned_char> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  uint3 uVar1;
  int3 iVar2;
  int3 iVar3;
  int3 iVar4;
  uint3 uVar5;
  uint3 uVar6;
  
  uVar6 = -(uint3)(((uint3)rb & 0xff) < ((uint3)ra & 0xff)) | 1;
  iVar2 = ((int3)x - ((uint3)rb & 0xff)) * uVar6;
  context = &this->context_run_mode_;
  encode_run_interruption_error(this,context->_M_elems,(int)(char)iVar2);
  uVar1 = (uint3)rb >> 8 & 0xff;
  uVar5 = -(uint3)(uVar1 < ((uint3)ra >> 8 & 0xff)) | 1;
  iVar4 = (((uint3)x >> 8) - uVar1) * uVar5;
  encode_run_interruption_error(this,context->_M_elems,(int)(char)iVar4);
  uVar1 = -(uint3)((uint3)rb >> 0x10 < (uint3)ra >> 0x10) | 1;
  iVar3 = (((uint3)x >> 0x10) - ((uint3)rb >> 0x10)) * uVar1;
  encode_run_interruption_error(this,context->_M_elems,(int)(char)iVar3);
  return (triplet<unsigned_char>)
         (iVar2 * uVar6 + (int3)rb & 0xff |
         (iVar4 * uVar5 + ((uint3)rb >> 8) & 0xff) << 8 |
         (iVar3 * uVar1 + ((uint3)rb >> 0x10)) * 0x10000);
}

Assistant:

triplet<sample_type> encode_run_interruption_pixel(const triplet<sample_type> x, const triplet<sample_type> ra,
                                                       const triplet<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }